

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_escon_compliance_codes(tcv_t *tcv,tcv_escon_compliance_codes_t *codes)

{
  int iVar1;
  
  iVar1 = -4;
  if ((codes != (tcv_escon_compliance_codes_t *)0x0 && tcv != (tcv_t *)0x0) &&
     (tcv->data != (void *)0x0)) {
    codes->bmp = '\0';
    codes->bmp = *(byte *)((long)tcv->data + 5) >> 6;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int sfp_get_escon_compliance_codes(tcv_t *tcv, tcv_escon_compliance_codes_t *codes)
{
	if (tcv == NULL || codes == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	codes->bmp = 0;

	codes->bmp = (((sfp_data_t*)tcv->data)->a0[ESCON_COMPLIANCE_REG] & ESCON_MASK) >> 6;

	return 0;
}